

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O2

int load_checkpoint(int idx)

{
  char *name;
  undefined2 uVar1;
  long lVar2;
  int iVar3;
  int ialign;
  int igend;
  int irace;
  int irole;
  int playmode;
  char namebuf [256];
  
  uVar1 = loginfo._36_2_;
  iVar3 = -1;
  if ((-1 < idx) && (idx < cpcount)) {
    loginfo.out_of_sync = '\0';
    replay_end();
    freedynamicdata();
    replay_begin();
    replay_read_newgame(&turntime,&playmode,namebuf,&irole,&irace,&igend,&ialign);
    lVar2 = 0;
    fseek((FILE *)loginfo.flog,(long)checkpoints[(uint)idx].nexttoken,0);
    iVar3 = 1;
    program_state.restoring = iVar3;
    loginfo._36_2_ = uVar1;
    startup_common(namebuf,playmode);
    dorecover(&checkpoints[(uint)idx].cpdata);
    checkpoints[(uint)idx].cpdata.pos = 0;
    mfree(&diff_base);
    mnew(&diff_base,(memfile *)0x0);
    iflags.disable_log = '\x01';
    program_state.game_running = iVar3;
    program_state.viewing = iVar3;
    while( true ) {
      name = *(char **)((long)&(checkpoints[(uint)idx].opt)->name + lVar2);
      if (name == (char *)0x0) break;
      nh_set_option(name,*(nh_optvalue *)((long)&(checkpoints[(uint)idx].opt)->value + lVar2),'\0');
      lVar2 = lVar2 + 0x30;
    }
    savegame(&diff_base);
    iVar3 = checkpoints[(uint)idx].actions;
  }
  return iVar3;
}

Assistant:

static int load_checkpoint(int idx)
{
    int playmode, i, irole, irace, igend, ialign;
    boolean cmd_invalid, diff_invalid;
    char namebuf[BUFSZ];
    
    if (idx < 0 || idx >= cpcount)
	return -1;
    
    cmd_invalid = loginfo.cmds_are_invalid;
    diff_invalid = loginfo.diffs_are_invalid;
    loginfo.out_of_sync = FALSE; /* we're destroying saved state anyway */

    replay_end();
    freedynamicdata();

    replay_begin();
    replay_read_newgame(&turntime, &playmode, namebuf,
			&irole, &irace, &igend, &ialign);
    fseek(loginfo.flog, checkpoints[idx].nexttoken, SEEK_SET);

    loginfo.cmds_are_invalid = cmd_invalid;
    loginfo.diffs_are_invalid = diff_invalid;

    program_state.restoring = TRUE;
    startup_common(namebuf, playmode);
    dorecover(&checkpoints[idx].cpdata);
    checkpoints[idx].cpdata.pos = 0;

    mfree(&diff_base);
    mnew(&diff_base, NULL);

    iflags.disable_log = TRUE;
    program_state.viewing = TRUE;
    program_state.game_running = TRUE;
    
    /* restore the full option state of the time of the checkpoint */
    for (i = 0; checkpoints[idx].opt[i].name; i++)
	nh_set_option(checkpoints[idx].opt[i].name, checkpoints[idx].opt[i].value, FALSE);

    savegame(&diff_base);

    return checkpoints[idx].actions;
}